

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_parser_setup(mpack_tree_parser_t *parser,mpack_tree_t *tree)

{
  mpack_tree_page_t *pmVar1;
  mpack_tree_page_t *page;
  mpack_tree_t *tree_local;
  mpack_tree_parser_t *parser_local;
  
  memset(parser,0,0x40);
  parser->tree = tree;
  parser->possible_nodes_left = tree->data_length;
  if (tree->pool == (mpack_node_data_t *)0x0) {
    pmVar1 = (mpack_tree_page_t *)malloc(0xff8);
    if (pmVar1 == (mpack_tree_page_t *)0x0) {
      tree->error = mpack_error_memory;
    }
    else {
      pmVar1->next = (mpack_tree_page_t *)0x0;
      tree->next = pmVar1;
      parser->nodes = pmVar1->nodes;
      parser->nodes_left = 0xff;
      tree->root = pmVar1->nodes;
    }
  }
  else {
    parser->nodes = tree->pool;
    parser->nodes_left = tree->pool_count;
  }
  return;
}

Assistant:

static void mpack_tree_parser_setup(mpack_tree_parser_t* parser, mpack_tree_t* tree) {
    mpack_memset(parser, 0, sizeof(*parser));
    parser->tree = tree;
    parser->possible_nodes_left = tree->data_length;

    #ifdef MPACK_MALLOC
    if (tree->pool == NULL) {

        // allocate first page
        mpack_tree_page_t* page = (mpack_tree_page_t*)MPACK_MALLOC(MPACK_PAGE_ALLOC_SIZE);
        mpack_log("allocated initial page %p of size %i count %i\n",
                page, (int)MPACK_PAGE_ALLOC_SIZE, (int)MPACK_NODES_PER_PAGE);
        if (page == NULL) {
            tree->error = mpack_error_memory;
            return;
        }
        page->next = NULL;
        tree->next = page;

        parser->nodes = page->nodes;
        parser->nodes_left = MPACK_NODES_PER_PAGE;
        tree->root = page->nodes;
        return;
    }
    #endif

    // otherwise use the provided pool
    mpack_assert(tree->pool != NULL, "no pool provided?");
    parser->nodes = tree->pool;
    parser->nodes_left = tree->pool_count;
}